

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int addlinef(buffer *bp,char *fmt,...)

{
  line *plVar1;
  line *plVar2;
  char in_AL;
  int iVar3;
  line *lp;
  size_t sVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  va_list ap;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  lp = lalloc(0);
  iVar3 = 0;
  if (lp != (line *)0x0) {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    local_48 = 0x3000000010;
    iVar3 = vasprintf(&lp->l_text,fmt,&local_48);
    if (iVar3 == -1) {
      lfree(lp);
      iVar3 = 0;
    }
    else {
      sVar4 = strlen(lp->l_text);
      lp->l_used = (int)sVar4;
      plVar1 = bp->b_headp;
      plVar2 = plVar1->l_bp;
      plVar2->l_fp = lp;
      lp->l_bp = plVar2;
      plVar1->l_bp = lp;
      lp->l_fp = plVar1;
      bp->b_lines = bp->b_lines + 1;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int
addlinef(struct buffer *bp, char *fmt, ...)
{
	va_list		 ap;
	struct line	*lp;

	if ((lp = lalloc(0)) == NULL)
		return (FALSE);
	va_start(ap, fmt);
	if (vasprintf(&lp->l_text, fmt, ap) == -1) {
		lfree(lp);
		va_end(ap);
		return (FALSE);
	}
	lp->l_used = strlen(lp->l_text);
	va_end(ap);

	bp->b_headp->l_bp->l_fp = lp;		/* Hook onto the end	 */
	lp->l_bp = bp->b_headp->l_bp;
	bp->b_headp->l_bp = lp;
	lp->l_fp = bp->b_headp;
	bp->b_lines++;

	return (TRUE);
}